

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::testShader
               (NegativeTestContext *ctx,ImageOperation function,MemoryQualifier memory,
               TextureType imageType,TextureFormat *format)

{
  ShaderType shaderType;
  RenderContext *renderCtx;
  int iVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  ProgramSources *sources;
  MemoryQualifier memory_00;
  MemoryQualifier memory_01;
  ImageOperation function_00;
  TextureFormat *format_00;
  TextureFormat *format_01;
  undefined4 in_register_00000034;
  bool *pbVar7;
  long lVar8;
  string local_360;
  _anonymous_namespace_ *local_340;
  TextureFormat *local_338;
  undefined1 local_330 [8];
  _Alloc_hider local_328;
  undefined1 local_320 [24];
  ulong local_308;
  MemoryQualifier local_300;
  uint local_2fc;
  long local_2f8;
  TestLog *local_2f0;
  long local_2e8;
  string shaderSource;
  string local_2c0;
  string local_2a0;
  string extension;
  ShaderProgram program;
  
  local_2f0 = (ctx->super_CallLogWrapper).m_log;
  local_338 = format;
  NegativeTestShared::(anonymous_namespace)::getFunctionName_abi_cxx11_
            (&local_360,(_anonymous_namespace_ *)CONCAT44(in_register_00000034,function),memory);
  std::operator+(&shaderSource,&local_360," ");
  NegativeTestShared::(anonymous_namespace)::getMemoryQualifier_abi_cxx11_
            (&local_2a0,(_anonymous_namespace_ *)(ulong)memory,memory_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                 &shaderSource,&local_2a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330," ")
  ;
  NegativeTestShared::(anonymous_namespace)::getShaderImageLayoutQualifier_abi_cxx11_
            (&local_2c0,(_anonymous_namespace_ *)local_338,format_00);
  std::operator+(&extension,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                 &local_2c0);
  local_340 = (_anonymous_namespace_ *)(ulong)function;
  local_300 = memory;
  NegativeTestContext::beginSection(ctx,&extension);
  std::__cxx11::string::~string((string *)&extension);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::~string((string *)local_330);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&shaderSource);
  std::__cxx11::string::~string((string *)&local_360);
  local_2f8 = (ulong)imageType << 2;
  lVar8 = 0;
  bVar2 = ~(0x9fU >> ((byte)imageType & 0x1f));
  local_2fc = (int)local_340 - 2;
  local_308 = (ulong)imageType;
  do {
    if (lVar8 == 0x18) {
      NegativeTestContext::endSection(ctx);
      return;
    }
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar8);
    bVar3 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar3) {
      local_2e8 = lVar8;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&program,"Verify shader: ",(allocator<char> *)local_330);
      pcVar4 = glu::getShaderTypeName(shaderType);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extension
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                     pcVar4);
      NegativeTestContext::beginSection(ctx,&extension);
      std::__cxx11::string::~string((string *)&extension);
      std::__cxx11::string::~string((string *)&program);
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_finish._0_4_ = 0;
      program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      program.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_start =
           (pointer)&program.m_shaders[0].
                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
      program.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      program.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
      .super__Vector_impl_data._M_finish =
           program.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
      glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extension,"GLSL_VERSION_DECL",(allocator<char> *)local_330);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&program,(key_type *)&extension);
      std::__cxx11::string::assign((char *)pmVar5);
      bVar3 = (uint)local_308 < 8;
      std::__cxx11::string::~string((string *)&extension);
      extension._M_dataplus._M_p = (pointer)&extension.field_2;
      extension._M_string_length = 0;
      extension.field_2._M_local_buf[0] = '\0';
      if (bVar3 && (bVar2 & 1) == 0) {
        std::__cxx11::string::assign((char *)&extension);
        local_330 = (undefined1  [8])local_320;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)extension._M_dataplus._M_p == &extension.field_2) {
          local_320._8_8_ = extension.field_2._8_8_;
        }
        else {
          local_330 = (undefined1  [8])extension._M_dataplus._M_p;
        }
        local_320._1_7_ = extension.field_2._M_allocated_capacity._1_7_;
        local_320[0] = extension.field_2._M_local_buf[0];
        local_328._M_p = (pointer)extension._M_string_length;
        extension._M_string_length = 0;
        extension.field_2._M_local_buf[0] = '\0';
        extension._M_dataplus._M_p = (pointer)&extension.field_2;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_330,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&local_360);
      }
      std::__cxx11::string::~string((string *)&extension);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extension,"GLSL_TYPE_EXTENSION",(allocator<char> *)&local_360);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&program,(key_type *)&extension);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)local_330);
      std::__cxx11::string::~string((string *)&extension);
      std::__cxx11::string::~string((string *)local_330);
      if (local_2fc < 8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&extension,"#extension GL_OES_shader_image_atomic : enable",
                   (allocator<char> *)local_330);
      }
      else if ((uint)local_340 < 2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&extension,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)local_330);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&extension,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)local_330);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_330,"GLSL_FUNCTION_EXTENSION",(allocator<char> *)&local_360);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&program,(key_type *)local_330);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&extension);
      std::__cxx11::string::~string((string *)local_330);
      std::__cxx11::string::~string((string *)&extension);
      glu::getGLShaderType(shaderType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extension,"GEOMETRY_SHADER_LAYOUT",(allocator<char> *)local_330);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&program,(key_type *)&extension);
      std::__cxx11::string::assign((char *)pmVar5);
      std::__cxx11::string::~string((string *)&extension);
      NegativeTestShared::(anonymous_namespace)::getShaderImageLayoutQualifier_abi_cxx11_
                (&extension,(_anonymous_namespace_ *)local_338,format_01);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_330,"LAYOUT_FORMAT",(allocator<char> *)&local_360);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&program,(key_type *)local_330);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&extension);
      std::__cxx11::string::~string((string *)local_330);
      std::__cxx11::string::~string((string *)&extension);
      NegativeTestShared::(anonymous_namespace)::getMemoryQualifier_abi_cxx11_
                (&extension,(_anonymous_namespace_ *)(ulong)local_300,memory_01);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_330,"MEMORY_QUALIFIER",(allocator<char> *)&local_360);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&program,(key_type *)local_330);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&extension);
      std::__cxx11::string::~string((string *)local_330);
      std::__cxx11::string::~string((string *)&extension);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&extension);
      uVar6 = (ulong)local_338->type;
      if (uVar6 < 0x24) {
        if ((0xc00000009U >> (uVar6 & 0x3f) & 1) == 0) {
          pbVar7 = (bool *)0x18936c1;
          if ((0x38000000UL >> (uVar6 & 0x3f) & 1) == 0) {
            if ((0x2c0000000U >> (uVar6 & 0x3f) & 1) == 0) goto LAB_01353e74;
            pbVar7 = (bool *)0x1727a24;
          }
        }
        else {
          pbVar7 = glcts::fixed_sample_locations_values + 1;
        }
        std::operator<<((ostream *)&extension,pbVar7);
        std::operator<<((ostream *)&extension,"image");
        if ((uint)local_308 < 8 && (bVar2 & 1) == 0) {
          std::operator<<((ostream *)&extension,&DAT_018ca188 + *(int *)(&DAT_018ca188 + local_2f8))
          ;
          std::__cxx11::stringbuf::str();
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_330,glcts::fixed_sample_locations_values + 1,
                     (allocator<char> *)&local_360);
        }
      }
      else {
LAB_01353e74:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_330,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&local_360);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extension);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extension,"IMAGE_TYPE",(allocator<char> *)&local_360);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&program,(key_type *)&extension);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)local_330);
      std::__cxx11::string::~string((string *)&extension);
      std::__cxx11::string::~string((string *)local_330);
      NegativeTestShared::(anonymous_namespace)::getFunctionName_abi_cxx11_
                (&extension,local_340,function_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_330,"FUNCTION_NAME",(allocator<char> *)&local_360);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&program,(key_type *)local_330);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&extension);
      std::__cxx11::string::~string((string *)local_330);
      std::__cxx11::string::~string((string *)&extension);
      iVar1 = (int)local_308;
      if (iVar1 - 1U < 4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&extension,"ivec3(1, 1, 1)",(allocator<char> *)local_330);
      }
      else if (iVar1 == 7) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&extension,"1",(allocator<char> *)local_330);
      }
      else if (iVar1 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&extension,"ivec2(1, 1)",(allocator<char> *)local_330);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&extension,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)local_330);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_330,"IMAGE_PARAM_P",(allocator<char> *)&local_360);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&program,(key_type *)local_330);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&extension);
      std::__cxx11::string::~string((string *)local_330);
      std::__cxx11::string::~string((string *)&extension);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&extension);
      std::operator<<((ostream *)&extension,", ");
      uVar6 = (ulong)local_338->type;
      if (uVar6 < 0x24) {
        if ((0xc00000009U >> (uVar6 & 0x3f) & 1) == 0) {
          pcVar4 = "i";
          if ((0x38000000UL >> (uVar6 & 0x3f) & 1) == 0) {
            if ((0x2c0000000U >> (uVar6 & 0x3f) & 1) == 0) goto LAB_01353e8d;
            pcVar4 = "u";
          }
          std::operator<<((ostream *)&extension,pcVar4);
          pcVar4 = ", 1";
        }
        else {
          std::operator<<((ostream *)&extension,glcts::fixed_sample_locations_values + 1);
          pcVar4 = ", 1.0";
        }
        switch((ulong)local_340 & 0xffffffff) {
        case 0:
          std::operator<<((ostream *)&extension,"vec4(1, 1, 1, 1)");
          std::__cxx11::stringbuf::str();
          break;
        case 1:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_330,glcts::fixed_sample_locations_values + 1,
                     (allocator<char> *)&local_360);
          break;
        case 2:
        case 3:
        case 4:
        case 5:
        case 6:
        case 7:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_330,", 1",(allocator<char> *)&local_360);
          break;
        case 8:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_330,pcVar4,(allocator<char> *)&local_360);
          break;
        case 9:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_330,", 1, 1",(allocator<char> *)&local_360);
          break;
        default:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_330,glcts::fixed_sample_locations_values + 1,
                     (allocator<char> *)&local_360);
        }
      }
      else {
LAB_01353e8d:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_330,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&local_360);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extension);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extension,"FUNCTION_ARGUMENTS",(allocator<char> *)&local_360);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&program,(key_type *)&extension);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)local_330);
      std::__cxx11::string::~string((string *)&extension);
      std::__cxx11::string::~string((string *)local_330);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_330,
                 "${GLSL_VERSION_DECL}\n${GLSL_TYPE_EXTENSION}\n${GLSL_FUNCTION_EXTENSION}\n${GEOMETRY_SHADER_LAYOUT}\nlayout(${LAYOUT_FORMAT}, binding = 0) highp uniform ${MEMORY_QUALIFIER} ${IMAGE_TYPE} u_img0;\nvoid main(void)\n{\n ${FUNCTION_NAME}(u_img0, ${IMAGE_PARAM_P}${FUNCTION_ARGUMENTS});\n}\n"
                 ,(allocator<char> *)&local_360);
      tcu::StringTemplate::StringTemplate((StringTemplate *)&extension,(string *)local_330);
      tcu::StringTemplate::specialize
                (&shaderSource,(StringTemplate *)&extension,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&program);
      tcu::StringTemplate::~StringTemplate((StringTemplate *)&extension);
      std::__cxx11::string::~string((string *)local_330);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&program);
      renderCtx = ctx->m_renderCtx;
      memset((MessageBuilder *)&extension,0,0xac);
      local_330._0_4_ = shaderType;
      std::__cxx11::string::string((string *)&local_328,(string *)&shaderSource);
      sources = glu::ProgramSources::operator<<
                          ((ProgramSources *)&extension,(ShaderSource *)local_330);
      glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
      std::__cxx11::string::~string((string *)&local_328);
      glu::ProgramSources::~ProgramSources((ProgramSources *)&extension);
      if (*(bool *)((long)&(*program.m_shaders[shaderType].
                             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_info + 0x48) == true) {
        glu::operator<<(local_2f0,&program);
        extension._M_dataplus._M_p = (pointer)local_2f0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&extension._M_string_length);
        std::operator<<((ostream *)&extension._M_string_length,
                        "Expected program to fail, but compilation passed.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&extension,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extension._M_string_length);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&extension,"Shader was not expected to compile.",
                   (allocator<char> *)local_330);
        NegativeTestContext::fail(ctx,&extension);
        std::__cxx11::string::~string((string *)&extension);
      }
      NegativeTestContext::endSection(ctx);
      glu::ShaderProgram::~ShaderProgram(&program);
      std::__cxx11::string::~string((string *)&shaderSource);
      lVar8 = local_2e8;
    }
    lVar8 = lVar8 + 4;
  } while( true );
}

Assistant:

void testShader (NegativeTestContext& ctx, ImageOperation function, MemoryQualifier memory, glu::TextureTestUtil::TextureType imageType, const tcu::TextureFormat& format)
{
	tcu::TestLog& log = ctx.getLog();
	ctx.beginSection(getFunctionName(function) + " " + getMemoryQualifier(memory) + " " + getShaderImageLayoutQualifier(format));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_shaders); ndx++)
	{
		if (ctx.isShaderSupported(s_shaders[ndx]))
		{
			ctx.beginSection(std::string("Verify shader: ") + glu::getShaderTypeName(s_shaders[ndx]));
			std::string					shaderSource(generateShaderSource(function, memory, imageType, format, s_shaders[ndx]));
			const glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources() << glu::ShaderSource(s_shaders[ndx], shaderSource));
			if (program.getShaderInfo(s_shaders[ndx]).compileOk)
			{
				log << program;
				log << tcu::TestLog::Message << "Expected program to fail, but compilation passed." << tcu::TestLog::EndMessage;
				ctx.fail("Shader was not expected to compile.");
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}